

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

void __thiscall
spvtools::opt::Instruction::ForEachInOperand(Instruction *this,function<void_(unsigned_int_*)> *f)

{
  anon_class_8_1_54a39806 local_40;
  function<bool_(unsigned_int_*)> local_38;
  function<void_(unsigned_int_*)> *local_18;
  function<void_(unsigned_int_*)> *f_local;
  Instruction *this_local;
  
  local_40.f = f;
  local_18 = f;
  f_local = (function<void_(unsigned_int_*)> *)this;
  std::function<bool(unsigned_int*)>::
  function<spvtools::opt::Instruction::ForEachInOperand(std::function<void(unsigned_int*)>const&)::_lambda(unsigned_int*)_1_,void>
            ((function<bool(unsigned_int*)> *)&local_38,&local_40);
  WhileEachInOperand(this,&local_38);
  std::function<bool_(unsigned_int_*)>::~function(&local_38);
  return;
}

Assistant:

inline void Instruction::ForEachInOperand(
    const std::function<void(uint32_t*)>& f) {
  WhileEachInOperand([&f](uint32_t* operand) {
    f(operand);
    return true;
  });
}